

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O0

RealType __thiscall OpenMD::Torsion::getValue(Torsion *this,int snapshotNo)

{
  undefined4 in_ESI;
  Vector<double,_3U> *in_RDI;
  double dVar1;
  Vector<double,_3U> *v2;
  RealType cos_phi;
  RealType rB;
  Vector3d B;
  RealType rA;
  Vector3d A;
  Vector3d r43;
  Vector3d r32;
  Vector3d r21;
  Vector3d pos4;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> *in_stack_fffffffffffffeb0;
  Vector<double,_3U> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  StuntDouble *in_stack_fffffffffffffec8;
  Vector3<double> *in_stack_ffffffffffffff10;
  Vector3<double> *in_stack_ffffffffffffff18;
  Vector3d *in_stack_ffffffffffffff28;
  Snapshot *in_stack_ffffffffffffff30;
  double local_8;
  
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),0);
  StuntDouble::getPos(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),1);
  StuntDouble::getPos(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),2);
  StuntDouble::getPos(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),3);
  StuntDouble::getPos(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  OpenMD::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffeb0,in_RDI);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  OpenMD::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffeb0,in_RDI);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  OpenMD::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffeb0,in_RDI);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  cross<double>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  dVar1 = Vector<double,_3U>::length((Vector<double,_3U> *)0x272e7e);
  cross<double>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  v2 = (Vector<double,_3U> *)Vector<double,_3U>::length((Vector<double,_3U> *)0x272ea5);
  if (1e-06 <= dVar1 * (double)v2) {
    Vector<double,_3U>::normalize(in_stack_fffffffffffffeb0);
    Vector<double,_3U>::normalize(in_stack_fffffffffffffeb0);
    dVar1 = dot<double,3u>((Vector<double,_3U> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),v2);
    if (1.0 < dVar1) {
      dVar1 = 1.0;
    }
    if (dVar1 < -1.0) {
      dVar1 = -1.0;
    }
    local_8 = acos(dVar1);
  }
  else {
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  return local_8;
}

Assistant:

RealType getValue(int snapshotNo) {
      Vector3d pos1 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[2]->getPos(snapshotNo);
      Vector3d pos4 = atoms_[3]->getPos(snapshotNo);

      Vector3d r21 = pos1 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r21);
      Vector3d r32 = pos2 - pos3;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r32);
      Vector3d r43 = pos3 - pos4;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r43);

      //  Calculate the cross products and distances
      Vector3d A  = cross(r21, r32);
      RealType rA = A.length();
      Vector3d B  = cross(r32, r43);
      RealType rB = B.length();

      /*
         If either of the two cross product vectors is tiny, that means
         the three atoms involved are colinear, and the torsion angle is
         going to be undefined.  The easiest check for this problem is
         to use the product of the two lengths.
      */
      if (rA * rB < OpenMD::epsilon) return numeric_limits<double>::quiet_NaN();

      A.normalize();
      B.normalize();

      //  Calculate the sin and cos
      RealType cos_phi = dot(A, B);
      if (cos_phi > 1.0) cos_phi = 1.0;
      if (cos_phi < -1.0) cos_phi = -1.0;
      return acos(cos_phi);
    }